

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_expr.cpp
# Opt level: O0

double __thiscall nivalis::Expr::operator()(Expr *this,Environment *env)

{
  vector<double,_std::allocator<double>_> *in_stack_00000408;
  AST *in_stack_00000410;
  Environment *in_stack_00000418;
  vector<double,_std::allocator<double>_> *this_00;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1368b1);
  this_00 = (vector<double,_std::allocator<double>_> *)
            detail::eval_ast(in_stack_00000418,in_stack_00000410,in_stack_00000408);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return (double)this_00;
}

Assistant:

double Expr::operator()(Environment& env) const {
    return detail::eval_ast(env, ast);
}